

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_NewClassProto(Var protoParent,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *this;
  RecyclableObject *protoParent_00;
  DynamicObject *pDVar3;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  protoParent_00 = VarTo<Js::RecyclableObject>(protoParent);
  pDVar3 = JavascriptLibrary::CreateClassPrototypeObject(this,protoParent_00);
  pTVar2->noJsReentrancy = bVar1;
  return pDVar3;
}

Assistant:

Var JavascriptOperators::OP_NewClassProto(Var protoParent, ScriptContext * scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_NewClassProto, reentrancylock, scriptContext->GetThreadContext());
        return scriptContext->GetLibrary()->CreateClassPrototypeObject(VarTo<RecyclableObject>(protoParent));
        JIT_HELPER_END(Op_NewClassProto);
    }